

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O0

void check_ansv<unsigned_long,2>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,bool left,size_t nonsv)

{
  value_type vVar1;
  unsigned_long uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference puVar6;
  Message *pMVar7;
  char *pcVar8;
  ulong uVar9;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  const_reference pvVar11;
  undefined1 *puVar12;
  char *in_R9;
  bool local_5c1;
  bool local_4c1;
  bool local_479;
  AssertHelper local_468;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_9;
  size_type local_440;
  Message local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_8;
  size_type local_418;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3d0;
  unsigned_long local_3c8;
  unsigned_long m2_1;
  size_type local_3b8;
  Message local_3b0;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_378;
  undefined1 *local_370;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_340;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_338;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_330;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_328;
  ulong local_320;
  unsigned_long m_3;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_5;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_4;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_3;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_288;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_280;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_278;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_270;
  unsigned_long local_268;
  unsigned_long m2;
  size_type local_258;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_218;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1d0;
  ulong local_1c8;
  unsigned_long m_2;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  size_t s;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_140;
  unsigned_long local_138;
  unsigned_long m_1;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8;
  unsigned_long *local_d0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c0;
  unsigned_long local_b8;
  unsigned_long m;
  size_t i;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  undefined1 local_98 [8];
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  minquery;
  size_t nonsv_local;
  bool left_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_local;
  
  minquery.block_mins.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)nonsv;
  local_a0._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
  i = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(in);
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::rmq((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
         *)local_98,local_a0,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )i,0x100,8);
  for (m = 0; uVar2 = m,
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in), uVar2 < sVar4;
      m = m + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](nsv,m);
    if ((pointer)*pvVar5 ==
        minquery.block_mins.
        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((left) && (m != 0)) {
        local_c8._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_e0._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_d8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+(&local_e0,m);
        local_d0 = (unsigned_long *)
                   __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+(&local_d8,1);
        local_c0 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                   ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                            *)local_98,local_c8,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_d0);
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_c0);
        local_b8 = *puVar6;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        local_479 = true;
        if (*pvVar5 != local_b8) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,0);
          local_479 = *pvVar5 == local_b8;
        }
        testing::AssertionResult::AssertionResult((AssertionResult *)local_100,local_479);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
        if (!bVar3) {
          testing::Message::Message(&local_108);
          pMVar7 = testing::Message::operator<<(&local_108,(char (*) [7])" at i=");
          pMVar7 = testing::Message::operator<<(pMVar7,&m);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&m_1,(internal *)local_100,
                     (AssertionResult *)"in[i] == m || in[0] == m","false","true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x29,pcVar8);
          testing::internal::AssertHelper::operator=(&local_110,pMVar7);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          std::__cxx11::string::~string((string *)&m_1);
          testing::Message::~Message(&local_108);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      }
      else if ((!left) &&
              (uVar9 = m + 1,
              sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in),
              uVar9 < sVar4)) {
        local_150._M_current =
             (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in)
        ;
        local_148 = __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator+(&local_150,m);
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend(in);
        local_140 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                             *)local_98,local_148,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )gtest_ar__1.message_.ptr_);
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_140);
        local_138 = *puVar6;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_168,*pvVar5 == local_138)
        ;
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
        if (!bVar3) {
          testing::Message::Message(&local_170);
          pMVar7 = testing::Message::operator<<(&local_170,(char (*) [7])" at i=");
          pMVar7 = testing::Message::operator<<(pMVar7,&m);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&s,(internal *)local_168,(AssertionResult *)"in[i] == m","false",
                     "true",in_R9);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x2c,pcVar8);
          testing::internal::AssertHelper::operator=(&local_178,pMVar7);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&s);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      }
    }
    else {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](nsv,m);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pvVar5;
      if (left) {
        testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                  ((internal *)local_1b0,"s","i",(unsigned_long *)&gtest_ar.message_,&m);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar3) {
          testing::Message::Message(&local_1b8);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m_2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x31,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m_2,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m_2);
          testing::Message::~Message(&local_1b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        if (&(gtest_ar.message_.ptr_)->field_0x1 < m) {
          local_1e8._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          local_1e0 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_1e8,(difference_type)gtest_ar.message_.ptr_);
          local_1d8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_1e0,1);
          gtest_ar__2.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          _Var10 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&gtest_ar__2.message_,m);
          local_1d0 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                      ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                               *)local_98,local_1d8,_Var10);
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_1d0);
          local_1c8 = *puVar6;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          local_4c1 = false;
          if (*pvVar5 <= local_1c8) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in,(size_type)gtest_ar.message_.ptr_);
            local_4c1 = *pvVar5 <= local_1c8;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_208,local_4c1);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar3) {
            testing::Message::Message(&local_210);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_208,
                       (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_218,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x3a,pcVar8);
            testing::internal::AssertHelper::operator=(&local_218,&local_210);
            testing::internal::AssertHelper::~AssertHelper(&local_218);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_210);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          vVar1 = *pvVar5;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in,(size_type)gtest_ar.message_.ptr_);
          if (vVar1 == *pvVar5) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (nsv,(size_type)gtest_ar.message_.ptr_);
            if ((pointer)*pvVar5 !=
                minquery.block_mins.
                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (nsv,(size_type)gtest_ar.message_.ptr_);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in,*pvVar5);
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m)
              ;
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)local_248,"in[nsv[s]]","in[i]",pvVar5,pvVar11);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
              if (!bVar3) {
                testing::Message::Message(&local_250);
                pMVar7 = testing::Message::operator<<(&local_250,(char (*) [8])" for i=");
                pMVar7 = testing::Message::operator<<(pMVar7,&m);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[i]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,m);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[s]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,(size_type)gtest_ar.message_.ptr_);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [4])",s=");
                pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&gtest_ar.message_);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [10])", nsv[s]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (nsv,(size_type)gtest_ar.message_.ptr_);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [13])", in.size()=");
                local_258 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
                pMVar7 = testing::Message::operator<<(pMVar7,&local_258);
                pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&m2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,0x41,pcVar8);
                testing::internal::AssertHelper::operator=((AssertHelper *)&m2,pMVar7);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2);
                testing::Message::~Message(&local_250);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (nsv,(size_type)gtest_ar.message_.ptr_);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*pvVar5 + 1)
                  < gtest_ar.message_.ptr_) {
                local_288._M_current =
                     (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (nsv,(size_type)gtest_ar.message_.ptr_);
                local_280 = __gnu_cxx::
                            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ::operator+(&local_288,*pvVar5);
                local_278 = __gnu_cxx::
                            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ::operator+(&local_280,1);
                gtest_ar_2.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
                _Var10 = __gnu_cxx::
                         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&gtest_ar_2.message_,(difference_type)gtest_ar.message_.ptr_
                                    );
                local_270 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                            ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                                     *)local_98,local_278,_Var10);
                puVar6 = __gnu_cxx::
                         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_270);
                local_268 = *puVar6;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,m);
                testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                          ((internal *)local_2a8,"m2","in[i]",&local_268,pvVar5);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2a8);
                if (!bVar3) {
                  testing::Message::Message(&local_2b0);
                  pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,0x44,pcVar8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_3.message_,&local_2b0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_3.message_);
                  testing::Message::~Message(&local_2b0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
              }
            }
          }
          else {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
            testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                      ((internal *)local_2c8,"in[i]","m",pvVar5,&local_1c8);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
            if (!bVar3) {
              testing::Message::Message(&local_2d0);
              pMVar7 = testing::Message::operator<<(&local_2d0,(char (*) [8])" for i=");
              pMVar7 = testing::Message::operator<<(pMVar7,&m);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[i]=");
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
              pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[s]=");
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in,(size_type)gtest_ar.message_.ptr_);
              pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [4])",s=");
              pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&gtest_ar.message_);
              pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x49,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,pMVar7);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_2d0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
          }
        }
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,(size_type)gtest_ar.message_.ptr_);
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_2e8,"in[s]","in[i]",pvVar5,pvVar11);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
        if (!bVar3) {
          testing::Message::Message(&local_2f0);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x53,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_2f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_2f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
      }
      else {
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  ((internal *)local_308,"s","i",(unsigned_long *)&gtest_ar.message_,&m);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
        if (!bVar3) {
          testing::Message::Message(&local_310);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&m_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x57,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&m_3,&local_310);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m_3);
          testing::Message::~Message(&local_310);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
        if (m < (undefined1 *)((long)&gtest_ar.message_.ptr_[-1].field_2 + 0xfU)) {
          local_340._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          local_338 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_340,m);
          local_330 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator+(&local_338,1);
          gtest_ar__3.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
          _Var10 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&gtest_ar__3.message_,(difference_type)gtest_ar.message_.ptr_);
          local_328 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                      ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                               *)local_98,local_330,_Var10);
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_328);
          local_320 = *puVar6;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          local_5c1 = false;
          if (*pvVar5 <= local_320) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in,(size_type)gtest_ar.message_.ptr_);
            local_5c1 = *pvVar5 <= local_320;
          }
          testing::AssertionResult::AssertionResult((AssertionResult *)local_360,local_5c1);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
          if (!bVar3) {
            testing::Message::Message(&local_368);
            pMVar7 = testing::Message::operator<<(&local_368,(char (*) [13])" for range [");
            pMVar7 = testing::Message::operator<<(pMVar7,&m);
            pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [2])",");
            local_370 = (undefined1 *)((long)&gtest_ar.message_.ptr_[-1].field_2 + 0xf);
            pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&local_370);
            pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [2])0x1d57b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_6.message_,(internal *)local_360,
                       (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_378,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x5e,pcVar8);
            testing::internal::AssertHelper::operator=(&local_378,pMVar7);
            testing::internal::AssertHelper::~AssertHelper(&local_378);
            std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_368);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
          vVar1 = *pvVar5;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in,(size_type)gtest_ar.message_.ptr_);
          if (vVar1 == *pvVar5) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (nsv,(size_type)gtest_ar.message_.ptr_);
            if ((pointer)*pvVar5 !=
                minquery.block_mins.
                super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (nsv,(size_type)gtest_ar.message_.ptr_);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in,*pvVar5);
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m)
              ;
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)local_3a8,"in[nsv[s]]","in[i]",pvVar5,pvVar11);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
              if (!bVar3) {
                testing::Message::Message(&local_3b0);
                pMVar7 = testing::Message::operator<<(&local_3b0,(char (*) [8])" for i=");
                pMVar7 = testing::Message::operator<<(pMVar7,&m);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[i]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,m);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[s]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,(size_type)gtest_ar.message_.ptr_);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [4])",s=");
                pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&gtest_ar.message_);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [10])", nsv[s]=");
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (nsv,(size_type)gtest_ar.message_.ptr_);
                pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [13])", in.size()=");
                local_3b8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
                pMVar7 = testing::Message::operator<<(pMVar7,&local_3b8);
                pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&m2_1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,100,pcVar8);
                testing::internal::AssertHelper::operator=((AssertHelper *)&m2_1,pMVar7);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2_1);
                testing::Message::~Message(&local_3b0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
              puVar12 = &(gtest_ar.message_.ptr_)->field_0x1;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (nsv,(size_type)gtest_ar.message_.ptr_);
              if (puVar12 < (undefined1 *)*pvVar5) {
                local_3e8._M_current =
                     (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
                local_3e0 = __gnu_cxx::
                            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ::operator+(&local_3e8,(difference_type)gtest_ar.message_.ptr_);
                local_3d8 = __gnu_cxx::
                            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ::operator+(&local_3e0,1);
                gtest_ar_7.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin(in);
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (nsv,(size_type)gtest_ar.message_.ptr_);
                _Var10 = __gnu_cxx::
                         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator+((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)&gtest_ar_7.message_,*pvVar5);
                local_3d0 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                            ::query((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                                     *)local_98,local_3d8,_Var10);
                puVar6 = __gnu_cxx::
                         __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ::operator*(&local_3d0);
                local_3c8 = *puVar6;
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (in,m);
                testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                          ((internal *)local_408,"m2","in[i]",&local_3c8,pvVar5);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_408);
                if (!bVar3) {
                  testing::Message::Message(&local_410);
                  pMVar7 = testing::Message::operator<<(&local_410,(char (*) [8])" for i=");
                  pMVar7 = testing::Message::operator<<(pMVar7,&m);
                  pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[i]=");
                  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (in,m);
                  pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                  pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[s]=");
                  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (in,(size_type)gtest_ar.message_.ptr_);
                  pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                  pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [4])",s=");
                  pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&gtest_ar.message_);
                  pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [10])", nsv[s]=");
                  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (nsv,(size_type)gtest_ar.message_.ptr_);
                  pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
                  pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [13])", in.size()=");
                  local_418 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
                  pMVar7 = testing::Message::operator<<(pMVar7,&local_418);
                  pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,0x67,pcVar8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,pMVar7);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_410);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
              }
            }
          }
          else {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
            testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                      ((internal *)local_430,"in[i]","m",pvVar5,&local_320);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
            if (!bVar3) {
              testing::Message::Message(&local_438);
              pMVar7 = testing::Message::operator<<(&local_438,(char (*) [8])" for i=");
              pMVar7 = testing::Message::operator<<(pMVar7,&m);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[i]=");
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
              pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [9])", in[s]=");
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (in,(size_type)gtest_ar.message_.ptr_);
              pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [4])",s=");
              pMVar7 = testing::Message::operator<<(pMVar7,(unsigned_long *)&gtest_ar.message_);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [10])", nsv[s]=");
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (nsv,(size_type)gtest_ar.message_.ptr_);
              pMVar7 = testing::Message::operator<<(pMVar7,pvVar5);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [13])", in.size()=");
              local_440 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in);
              pMVar7 = testing::Message::operator<<(pMVar7,&local_440);
              pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x6d,pcVar8);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_9.message_,pMVar7);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_438);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
          }
        }
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in,(size_type)gtest_ar.message_.ptr_);
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in,m);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_458,"in[s]","in[i]",pvVar5,pvVar11);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
        if (!bVar3) {
          testing::Message::Message(&local_460);
          pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
          testing::internal::AssertHelper::AssertHelper
                    (&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                     ,0x77,pcVar8);
          testing::internal::AssertHelper::operator=(&local_468,&local_460);
          testing::internal::AssertHelper::~AssertHelper(&local_468);
          testing::Message::~Message(&local_460);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
      }
    }
  }
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::~rmq((rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
          *)local_98);
  return;
}

Assistant:

void check_ansv(const std::vector<T>& in, const std::vector<size_t>& nsv, bool left, size_t nonsv) {
    // construct RMQ
    rmq<typename std::vector<T>::const_iterator> minquery(in.cbegin(), in.cend());

    // for each position check the nsv and direction
    for (size_t i = 0; i < in.size(); ++i) {
        if (nsv[i] == nonsv) {
            if (left && i > 0) {
                // expect this is an overall minimum of the range [0, i]
                T m = *minquery.query(in.cbegin(), in.cbegin()+i+1);
                EXPECT_TRUE(in[i] == m || in[0] == m) << " at i=" << i;
            } else if (!left && i+1 < in.size()) {
                T m = *minquery.query(in.cbegin()+i, in.cend());
                EXPECT_TRUE(in[i] == m) << " at i=" << i;
            }
        } else {
            size_t s = nsv[i];
            if (left) {
                EXPECT_LT(s, i);
                // no other element can be smaller than `in[i]` after `in[s]`
                if (s+1 < i) {
                    T m = *minquery.query(in.cbegin()+s+1, in.cbegin()+i);
                    if (type == nearest_sm) {
                        // check that there is nothing smaller than in[i] in the range
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << s+1 << "," << i << "]";
                    } else if (type == furthest_eq) {
                        // test that no smaller values lay in between
                        EXPECT_TRUE(in[i] <= m && in[s] <= m);

                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (nsv[s]+1 < s) {
                                    T m2 = *minquery.query(in.cbegin()+nsv[s]+1, in.cbegin()+s);
                                    EXPECT_GT(m2, in[i]);
                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s;
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m);
                    }
                }
                // element at `s` is smaller than `in[i]`
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }

            } else {
                EXPECT_GT(s, i);
                // no other element can be smaller than `in[i]` before `in[s]`
                if (i < s-1) {
                    T m = *minquery.query(in.cbegin()+i+1, in.cbegin()+s);
                    if (type == nearest_sm) {
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    } else if (type == furthest_eq) {
                        EXPECT_TRUE(in[i] <= m && in[s] <= m) << " for range [" << i << "," << s-1 << "]";
                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (s+1 < nsv[s]) {
                                    T m2 = *minquery.query(in.cbegin()+s+1, in.cbegin()+nsv[s]);
                                    EXPECT_GT(m2, in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();

                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    }
                }
                // element at `s` is smaller than in[i]
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }
            }

        }
    }
}